

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

SFormat lj_strfmt_parse(FormatState *fs)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  MSize MVar8;
  uint uVar9;
  byte *pbVar10;
  
  pbVar1 = fs->p;
  fs->str = (char *)pbVar1;
  lVar7 = 1;
  pbVar3 = pbVar1;
  do {
    pbVar2 = pbVar3;
    pbVar10 = pbVar2;
    if (fs->e <= pbVar2) goto LAB_00115e18;
    pbVar3 = pbVar2 + 1;
    lVar7 = lVar7 + -1;
  } while (*pbVar2 != 0x25);
  bVar5 = *pbVar3;
  if (bVar5 == 0x25) {
    pbVar2 = pbVar2 + 2;
    pbVar10 = pbVar3;
  }
  else if (lVar7 == 0) {
    uVar4 = 0;
    while( true ) {
      pbVar2 = pbVar3 + 1;
      uVar6 = (uint)bVar5;
      if (0x10 < bVar5 - 0x20) break;
      if (bVar5 == 0x20) {
        uVar9 = 0x800;
      }
      else if (bVar5 == 0x23) {
        uVar9 = 0x1000;
      }
      else if (bVar5 == 0x30) {
        uVar9 = 0x400;
      }
      else {
        uVar9 = 0x100;
        if (uVar6 != 0x2d) {
          if (uVar6 != 0x2b) break;
          uVar9 = 0x200;
        }
      }
      uVar4 = uVar4 | uVar9;
      bVar5 = *pbVar2;
      pbVar3 = pbVar2;
    }
    uVar6 = uVar6 - 0x30;
    if (uVar6 < 10) {
      pbVar3 = pbVar3 + 2;
      uVar9 = (*pbVar2 - 0x30) + uVar6 * 10;
      if (9 < *pbVar2 - 0x30) {
        uVar9 = uVar6;
        pbVar3 = pbVar2;
      }
      uVar4 = uVar4 | uVar9 << 0x10;
      bVar5 = *pbVar3;
    }
    if (bVar5 == 0x2e) {
      bVar5 = pbVar3[1];
      uVar6 = bVar5 - 0x30;
      if (uVar6 < 10) {
        bVar5 = pbVar3[2];
        if (bVar5 - 0x30 < 10) {
          uVar6 = (bVar5 - 0x30) + uVar6 * 10;
          bVar5 = pbVar3[3];
          pbVar3 = pbVar3 + 3;
        }
        else {
          pbVar3 = pbVar3 + 2;
        }
      }
      else {
        pbVar3 = pbVar3 + 1;
        uVar6 = 0;
      }
      uVar4 = uVar4 | uVar6 * 0x1000000 + 0x1000000;
    }
    uVar6 = bVar5 - 0x41;
    if ((uVar6 < 0x38) && ((0x6a3e82ff7fff8eU >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
      bVar5 = "\x05"[uVar6];
      fs->p = pbVar3 + 1;
      return (uint)(uVar6 < 0x20) << 0xd | uVar4 | (uint)bVar5;
    }
    fs->len = (((int)pbVar3 + 1) - (uint)(bVar5 < 0x20)) - (int)pbVar1;
    fs->p = fs->e;
    return 1;
  }
LAB_00115e18:
  fs->p = pbVar2;
  MVar8 = (int)pbVar10 - (int)pbVar1;
  fs->len = MVar8;
  return (uint)(MVar8 != 0) * 2;
}

Assistant:

SFormat LJ_FASTCALL lj_strfmt_parse(FormatState *fs)
{
  const uint8_t *p = fs->p, *e = fs->e;
  fs->str = (const char *)p;
  for (; p < e; p++) {
    if (*p == '%') {  /* Escape char? */
      if (p[1] == '%') {  /* '%%'? */
	fs->p = ++p+1;
	goto retlit;
      } else {
	SFormat sf = 0;
	uint32_t c;
	if (p != (const uint8_t *)fs->str)
	  break;
	for (p++; (uint32_t)*p - ' ' <= (uint32_t)('0' - ' '); p++) {
	  /* Parse flags. */
	  if (*p == '-') sf |= STRFMT_F_LEFT;
	  else if (*p == '+') sf |= STRFMT_F_PLUS;
	  else if (*p == '0') sf |= STRFMT_F_ZERO;
	  else if (*p == ' ') sf |= STRFMT_F_SPACE;
	  else if (*p == '#') sf |= STRFMT_F_ALT;
	  else break;
	}
	if ((uint32_t)*p - '0' < 10) {  /* Parse width. */
	  uint32_t width = (uint32_t)*p++ - '0';
	  if ((uint32_t)*p - '0' < 10)
	    width = (uint32_t)*p++ - '0' + width*10;
	  sf |= (width << STRFMT_SH_WIDTH);
	}
	if (*p == '.') {  /* Parse precision. */
	  uint32_t prec = 0;
	  p++;
	  if ((uint32_t)*p - '0' < 10) {
	    prec = (uint32_t)*p++ - '0';
	    if ((uint32_t)*p - '0' < 10)
	      prec = (uint32_t)*p++ - '0' + prec*10;
	  }
	  sf |= ((prec+1) << STRFMT_SH_PREC);
	}
	/* Parse conversion. */
	c = (uint32_t)*p - 'A';
	if (LJ_LIKELY(c <= (uint32_t)('x' - 'A'))) {
	  uint32_t sx = strfmt_map[c];
	  if (sx) {
	    fs->p = p+1;
	    return (sf | sx | ((c & 0x20) ? 0 : STRFMT_F_UPPER));
	  }
	}
	/* Return error location. */
	if (*p >= 32) p++;
	fs->len = (MSize)(p - (const uint8_t *)fs->str);
	fs->p = fs->e;
	return STRFMT_ERR;
      }
    }
  }
  fs->p = p;
retlit:
  fs->len = (MSize)(p - (const uint8_t *)fs->str);
  return fs->len ? STRFMT_LIT : STRFMT_EOF;
}